

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

EnumVal * __thiscall
flatbuffers::EnumDef::ReverseLookup(EnumDef *this,int64_t enum_idx,bool skip_union_default)

{
  pointer ppEVar1;
  
  ppEVar1 = (this->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start + (byte)(skip_union_default & this->is_union);
  while( true ) {
    if (ppEVar1 ==
        (this->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (EnumVal *)0x0;
    }
    if ((*ppEVar1)->value == enum_idx) break;
    ppEVar1 = ppEVar1 + 1;
  }
  return *ppEVar1;
}

Assistant:

EnumVal *EnumDef::ReverseLookup(int64_t enum_idx,
                                bool skip_union_default) const {
  auto skip_first = static_cast<int>(is_union && skip_union_default);
  for (auto it = Vals().begin() + skip_first; it != Vals().end(); ++it) {
    if ((*it)->GetAsInt64() == enum_idx) { return *it; }
  }
  return nullptr;
}